

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_Basic_Test::TestBody(QUICMethodTest_Basic_Test *this)

{
  Span<const_unsigned_char> *pSVar1;
  tuple<ssl_session_st_*,_bssl::internal::Deleter> session_00;
  bool bVar2;
  int iVar3;
  pointer *__ptr;
  UniquePtr<SSL_SESSION> UVar4;
  char *message;
  char *in_R9;
  AssertHelper local_a8;
  UniquePtr<SSL_SESSION> session;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar;
  Span<const_unsigned_char> write_secret;
  AssertHelper local_50;
  Span<const_unsigned_char> read_secret;
  SSL_QUIC_METHOD quic_method;
  
  quic_method.set_read_secret = QUICMethodTest::SetReadSecretCallback;
  quic_method.set_write_secret = QUICMethodTest::SetWriteSecretCallback;
  quic_method.add_handshake_data = QUICMethodTest::AddHandshakeDataCallback;
  quic_method.flush_flight = QUICMethodTest::FlushFlightCallback;
  quic_method.send_alert = QUICMethodTest::SendAlertCallback;
  std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
             &(anonymous_namespace)::g_last_session,(pointer)0x0);
  SSL_CTX_set_session_cache_mode
            ((this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
  SSL_CTX_sess_set_new_cb
            ((SSL_CTX *)
             (this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,SaveLastSession);
  iVar3 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&quic_method);
  read_secret.size_ = 0;
  read_secret.data_ = (uchar *)CONCAT71(read_secret.data_._1_7_,iVar3 != 0);
  if (iVar3 == 0) {
    testing::Message::Message((Message *)&write_secret);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&read_secret,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1cae,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__6,(Message *)&write_secret);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&read_secret.size_);
    iVar3 = SSL_CTX_set_quic_method
                      ((this->super_QUICMethodTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&quic_method);
    read_secret.size_ = 0;
    read_secret.data_ = (uchar *)CONCAT71(read_secret.data_._1_7_,iVar3 != 0);
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&write_secret);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&read_secret,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__6,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1caf,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__6,(Message *)&write_secret);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&read_secret.size_);
      bVar2 = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
      read_secret.data_ = (uchar *)CONCAT71(read_secret.data_._1_7_,bVar2);
      read_secret.size_ = 0;
      if (bVar2) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&read_secret.size_);
        bVar2 = QUICMethodTest::CompleteHandshakesForQUIC(&this->super_QUICMethodTest);
        read_secret.data_ = (uchar *)CONCAT71(read_secret.data_._1_7_,bVar2);
        read_secret.size_ = 0;
        if (bVar2) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&read_secret.size_);
          QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
          iVar3 = SSL_session_reused((this->super_QUICMethodTest).client_._M_t.
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
          read_secret.size_ = 0;
          read_secret.data_ = (uchar *)CONCAT71(read_secret.data_._1_7_,iVar3 == 0);
          if (iVar3 != 0) {
            testing::Message::Message((Message *)&write_secret);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&read_secret,
                       (AssertionResult *)"SSL_session_reused(client_.get())","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__6,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cb5,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__6,(Message *)&write_secret);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if (write_secret.data_ != (uchar *)0x0) {
              (**(code **)(*(long *)write_secret.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&read_secret.size_);
          iVar3 = SSL_session_reused((this->super_QUICMethodTest).server_._M_t.
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
          read_secret.size_ = 0;
          read_secret.data_ = (uchar *)CONCAT71(read_secret.data_._1_7_,iVar3 == 0);
          if (iVar3 != 0) {
            testing::Message::Message((Message *)&write_secret);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&read_secret,
                       (AssertionResult *)"SSL_session_reused(server_.get())","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__6,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cb6,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__6,(Message *)&write_secret);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if (write_secret.data_ != (uchar *)0x0) {
              (**(code **)(*(long *)write_secret.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&read_secret.size_);
          read_secret.data_ = (uchar *)0x0;
          read_secret.size_ = 0;
          write_secret.data_ = (uchar *)0x0;
          write_secret.size_ = 0;
          bVar2 = SSL_get_traffic_secrets
                            ((this->super_QUICMethodTest).client_._M_t.
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,&read_secret,
                             &write_secret);
          bVar2 = !bVar2;
          gtest_ar__6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__6.success_ = bVar2;
          if (!bVar2) {
            testing::Message::Message((Message *)&session);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__6,
                       (AssertionResult *)
                       "SSL_get_traffic_secrets(client_.get(), &read_secret, &write_secret)","true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cbb,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&session);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
                session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)session._M_t.
                                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 8
                          ))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__6.message_);
          bVar2 = SSL_get_traffic_secrets
                            ((this->super_QUICMethodTest).server_._M_t.
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,&read_secret,
                             &write_secret);
          gtest_ar__6.success_ = !bVar2;
          gtest_ar__6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!gtest_ar__6.success_) {
            testing::Message::Message((Message *)&session);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__6,
                       (AssertionResult *)
                       "SSL_get_traffic_secrets(server_.get(), &read_secret, &write_secret)","true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cbd,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&session);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
                session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)session._M_t.
                                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 8
                          ))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__6.message_);
          gtest_ar__6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__6.success_ =
               (SSL_SESSION *)(anonymous_namespace)::g_last_session._M_head_impl ==
               (SSL_SESSION *)0x0;
          if (!gtest_ar__6.success_) {
            testing::Message::Message((Message *)&session);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__6,
                       (AssertionResult *)"g_last_session","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cc0,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&session);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
                session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)session._M_t.
                                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 8
                          ))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__6.message_);
          gtest_ar__6.success_ =
               QUICMethodTest::ProvideHandshakeData
                         ((this->super_QUICMethodTest).client_._M_t.
                          super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,0xffffffffffffffff);
          gtest_ar__6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (gtest_ar__6.success_) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__6.message_);
            gtest_ar__6._0_4_ =
                 SSL_process_quic_post_handshake
                           ((this->super_QUICMethodTest).client_._M_t.
                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
            session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._0_4_ = 1;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"SSL_process_quic_post_handshake(client_.get())","1",
                       (int *)&gtest_ar__6,(int *)&session);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar__6);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                message = "";
              }
              else {
                message = *(char **)gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&session,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1cc2,message);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&session,(Message *)&gtest_ar__6);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&session);
              if ((long *)CONCAT44(gtest_ar__6._4_4_,gtest_ar__6._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(gtest_ar__6._4_4_,gtest_ar__6._0_4_) + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            gtest_ar__6.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            bVar2 = (SSL_SESSION *)(anonymous_namespace)::g_last_session._M_head_impl !=
                    (SSL_SESSION *)0x0;
            gtest_ar__6.success_ = bVar2;
            if (!bVar2) {
              testing::Message::Message((Message *)&session);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar__6,
                         (AssertionResult *)"g_last_session","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_a8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1cc3,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
              testing::internal::AssertHelper::operator=(&local_a8,(Message *)&session);
              testing::internal::AssertHelper::~AssertHelper(&local_a8);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
                  session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)session._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl +
                            8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__6.message_);
            gtest_ar__6.success_ =
                 QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
            gtest_ar__6.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (gtest_ar__6.success_) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__6.message_);
              session_00.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>)
                   (_Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>)
                   (anonymous_namespace)::g_last_session._M_head_impl;
              session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
                   (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
                   (anonymous_namespace)::g_last_session._M_head_impl;
              (anonymous_namespace)::g_last_session._M_head_impl = (ssl_session_st *)0x0;
              SSL_set_session((SSL *)(this->super_QUICMethodTest).client_._M_t.
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                              (SSL_SESSION *)
                              session_00.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
              bVar2 = QUICMethodTest::CompleteHandshakesForQUIC(&this->super_QUICMethodTest);
              gtest_ar__6.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__6.success_ = bVar2;
              if (bVar2) {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__6.message_);
                QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
                iVar3 = SSL_session_reused((this->super_QUICMethodTest).client_._M_t.
                                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                gtest_ar__6.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar__6.success_ = iVar3 != 0;
                if (!gtest_ar__6.success_) {
                  testing::Message::Message((Message *)&local_a8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar__6,
                             (AssertionResult *)"SSL_session_reused(client_.get())","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_50,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1ccd,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
                  testing::internal::AssertHelper::~AssertHelper(&local_50);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  if (local_a8.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_a8.data_ + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__6.message_);
                iVar3 = SSL_session_reused((this->super_QUICMethodTest).server_._M_t.
                                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                gtest_ar__6.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar__6.success_ = iVar3 != 0;
                if (gtest_ar__6.success_) goto LAB_0019f8fb;
                testing::Message::Message((Message *)&local_a8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__6,
                           (AssertionResult *)"SSL_session_reused(server_.get())","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1cce,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
              }
              else {
                testing::Message::Message((Message *)&local_a8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__6,
                           (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1cca,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
              }
              testing::internal::AssertHelper::~AssertHelper(&local_50);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if (local_a8.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_a8.data_ + 8))();
              }
LAB_0019f8fb:
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__6.message_);
              std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session);
              return;
            }
            testing::Message::Message((Message *)&session);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__6,
                       (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cc6,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&session);
          }
          else {
            testing::Message::Message((Message *)&session);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__6,
                       (AssertionResult *)"ProvideHandshakeData(client_.get())","false","true",in_R9
                      );
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cc1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&session);
          }
          pSVar1 = (Span<const_unsigned_char> *)&gtest_ar__6;
          testing::internal::AssertHelper::~AssertHelper(&local_a8);
          std::__cxx11::string::~string((string *)&gtest_ar);
          UVar4 = session;
          goto LAB_0019f521;
        }
        testing::Message::Message((Message *)&write_secret);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&read_secret,
                   (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__6,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1cb2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__6,(Message *)&write_secret);
      }
      else {
        testing::Message::Message((Message *)&write_secret);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&read_secret,
                   (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__6,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1cb1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__6,(Message *)&write_secret);
      }
    }
  }
  pSVar1 = &read_secret;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6);
  std::__cxx11::string::~string((string *)&gtest_ar);
  UVar4._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)write_secret.data_;
LAB_0019f521:
  if ((tuple<ssl_session_st_*,_bssl::internal::Deleter>)
      UVar4._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
      (_Head_base<0UL,_ssl_session_st_*,_false>)0x0) {
    (**(code **)(*(long *)UVar4._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pSVar1->size_);
  return;
}

Assistant:

TEST_F(QUICMethodTest, Basic) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();

  g_last_session = nullptr;

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_sess_set_new_cb(client_ctx_.get(), SaveLastSession);
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  ASSERT_TRUE(CreateClientAndServer());
  ASSERT_TRUE(CompleteHandshakesForQUIC());

  ExpectHandshakeSuccess();
  EXPECT_FALSE(SSL_session_reused(client_.get()));
  EXPECT_FALSE(SSL_session_reused(server_.get()));

  // SSL_get_traffic_secrets is not defined for QUIC.
  Span<const uint8_t> read_secret, write_secret;
  EXPECT_FALSE(
      SSL_get_traffic_secrets(client_.get(), &read_secret, &write_secret));
  EXPECT_FALSE(
      SSL_get_traffic_secrets(server_.get(), &read_secret, &write_secret));

  // The server sent NewSessionTicket messages in the handshake.
  EXPECT_FALSE(g_last_session);
  ASSERT_TRUE(ProvideHandshakeData(client_.get()));
  EXPECT_EQ(SSL_process_quic_post_handshake(client_.get()), 1);
  EXPECT_TRUE(g_last_session);

  // Create a second connection to verify resumption works.
  ASSERT_TRUE(CreateClientAndServer());
  bssl::UniquePtr<SSL_SESSION> session = std::move(g_last_session);
  SSL_set_session(client_.get(), session.get());

  ASSERT_TRUE(CompleteHandshakesForQUIC());

  ExpectHandshakeSuccess();
  EXPECT_TRUE(SSL_session_reused(client_.get()));
  EXPECT_TRUE(SSL_session_reused(server_.get()));
}